

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O3

void __thiscall urllib::Request::initHeaders(Request *this)

{
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  this_00 = &this->headers_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_60,(char (*) [5])"Host",&this->host_);
  std::
  vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this_00,&local_60);
  paVar1 = &local_60.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.second._M_dataplus._M_p);
  }
  paVar2 = &local_60.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_const_char_(&)[77],_true>
            (&local_60,(char (*) [11])"User-Agent",
             (char (*) [77])
             "Mozilla/5.0 (X11; Ubuntu; Linux x86_64; rv:47.0) Gecko/20100101 Firefox/47.0");
  std::
  vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[7],_const_char_(&)[64],_true>
            (&local_60,(char (*) [7])"Accept",
             (char (*) [64])"text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8");
  std::
  vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[15],_true>
            (&local_60,(char (*) [16])"Accept-Language",(char (*) [15])"en-US,en;q=0.5");
  std::
  vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.second._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Request::initHeaders()
{
    headers_.push_back({"Host", host_});
    headers_.push_back({"User-Agent", "Mozilla/5.0 (X11; Ubuntu; Linux x86_64; rv:47.0) Gecko/20100101 Firefox/47.0"});
    headers_.push_back({"Accept", "text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8"});
    headers_.push_back({"Accept-Language", "en-US,en;q=0.5"});
}